

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

QStringList *
getQtLibsFromElf(QStringList *__return_storage_ptr__,Options *options,QString *fileName)

{
  QStringBuilder<QLatin1String,_QString_&> *this;
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  FILE *__stream;
  undefined8 __stream_00;
  Data *pDVar4;
  qsizetype qVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  QArrayData *pQVar8;
  Data *pDVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  QString *pQVar15;
  storage_type_conflict *psVar16;
  long in_FS_OFFSET;
  bool bVar17;
  QAnyStringView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  const_iterator cVar26;
  char buffer [512];
  undefined1 local_2f8 [16];
  QString *local_2e8;
  QString *local_2e0;
  QString local_2d8;
  QString local_2b8;
  QString local_298;
  QArrayData *local_278;
  QString *pQStack_270;
  storage_type_conflict *psStack_268;
  QArrayDataPointer<QString> local_258;
  QString local_238 [21];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_298.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_298.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_298.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  llvmReadobjPath(&local_298,options);
  cVar10 = QFile::exists((QString *)&local_298);
  if (cVar10 == '\0') {
    getQtLibsFromElf();
  }
  else {
    shellQuote(&local_2d8,&local_298);
    shellQuote((QString *)(local_2f8 + 8),fileName);
    local_258.size = local_2d8.d.size | 0x8000000000000000;
    local_238[0].d.d = (Data *)&local_258;
    local_258.d = (Data *)CONCAT71(local_258.d._1_7_,1);
    local_258.ptr = (QString *)local_2d8.d.ptr;
    psStack_268 = (storage_type_conflict *)((ulong)local_2e0 | 0x8000000000000000);
    local_238[0].d.ptr = (char16_t *)&local_278;
    local_278 = (QArrayData *)CONCAT71(local_278._1_7_,1);
    pQStack_270 = local_2e8;
    local_238[0].d.size = 0;
    QVar18.m_size = (size_t)"%1 --needed-libs %2";
    QVar18.field_0.m_data = &local_2b8;
    QtPrivate::argToQString(QVar18,0x4000000000000013,(ArgBase **)0x2);
    pcVar7 = local_298.d.ptr;
    pDVar6 = local_298.d.d;
    qVar5 = local_2b8.d.size;
    pDVar4 = local_2b8.d.d;
    local_2b8.d.d = local_298.d.d;
    local_298.d.d = pDVar4;
    local_298.d.ptr = local_2b8.d.ptr;
    local_2b8.d.ptr = pcVar7;
    local_2b8.d.size = local_298.d.size;
    local_298.d.size = qVar5;
    if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_2f8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_2f8._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_2f8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_2f8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_2f8._8_8_,2,0x10);
      }
    }
    if (&(local_2d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_2f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    openProcess((QString *)local_2f8);
    __stream_00 = local_2f8._0_8_;
    if ((FILE *)local_2f8._0_8_ == (FILE *)0x0) {
      getQtLibsFromElf();
    }
    else {
      local_258.d = (Data *)0x0;
      local_258.ptr = (QString *)0x0;
      local_258.size = 0;
      memset(local_238,0xaa,0x200);
      pcVar13 = fgets((char *)local_238,0x200,(FILE *)__stream_00);
      if (pcVar13 != (char *)0x0) {
        uVar12 = 0;
        do {
          psStack_268 = (storage_type_conflict *)strlen((char *)local_238);
          local_278 = (QArrayData *)0x0;
          local_2b8.d.size = 0;
          local_2b8.d.d = (Data *)0x0;
          local_2b8.d.ptr = (char16_t *)0x0;
          pQStack_270 = local_238;
          QByteArray::trimmed_helper((QByteArray *)&local_2d8);
          pQVar15 = pQStack_270;
          pQVar8 = local_278;
          qVar5 = local_2d8.d.size;
          pDVar4 = local_2d8.d.d;
          local_2d8.d.d = (Data *)local_278;
          local_278 = &pDVar4->super_QArrayData;
          pQStack_270 = (QString *)local_2d8.d.ptr;
          local_2d8.d.ptr = (char16_t *)pQVar15;
          local_2d8.d.size = (qsizetype)psStack_268;
          psStack_268 = (storage_type_conflict *)qVar5;
          if (pQVar8 != (QArrayData *)0x0) {
            LOCK();
            (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar8,1,0x10);
            }
          }
          psVar16 = psStack_268;
          pQVar15 = pQStack_270;
          if ((uVar12 & 1) == 0) {
            QVar21.m_data = (storage_type_conflict *)pQStack_270;
            QVar21.m_size = (qsizetype)psStack_268;
            QVar24.m_data = "Arch: ";
            QVar24.m_size = 6;
            cVar10 = QtPrivate::startsWith(QVar21,QVar24);
            if (cVar10 == '\0') {
LAB_0011dcf7:
              QVar22.m_data = (storage_type_conflict *)pQVar15;
              QVar22.m_size = (qsizetype)psVar16;
              QVar25.m_data = "NeededLibraries";
              QVar25.m_size = 0xf;
              uVar12 = QtPrivate::startsWith(QVar22,QVar25);
              bVar17 = false;
            }
            else {
              QByteArray::mid((longlong)&local_2d8,(longlong)&local_278);
              cVar26 = QHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
                                 (&elfArchitectures,(QByteArray *)&local_2d8);
              if (&(local_2d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,1,0x10);
                }
              }
              if (cVar26.i.d != (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 ||
                  cVar26.i.bucket != 0) {
                pSVar2 = (cVar26.i.d)->spans;
                uVar14 = cVar26.i.bucket >> 7;
                pEVar3 = pSVar2[uVar14].entries;
                bVar1 = pSVar2[uVar14].offsets[(uint)cVar26.i.bucket & 0x7f];
                QString::toLatin1_helper((QString *)&local_2d8);
                uVar14 = (ulong)((uint)bVar1 * 0x30);
                bVar17 = true;
                if (*(storage_type_conflict **)((pEVar3->storage).data + uVar14 + 0x28) ==
                    (storage_type_conflict *)local_2d8.d.size) {
                  if ((storage_type_conflict *)local_2d8.d.size == (storage_type_conflict *)0x0) {
                    bVar17 = false;
                  }
                  else {
                    iVar11 = bcmp(*(void **)((pEVar3->storage).data + uVar14 + 0x20),local_2d8.d.ptr
                                  ,local_2d8.d.size);
                    bVar17 = iVar11 != 0;
                  }
                }
                if (&(local_2d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,1,0x10);
                  }
                }
                pQVar15 = pQStack_270;
                psVar16 = psStack_268;
                if (!bVar17) goto LAB_0011dcf7;
              }
              __stream = _stdout;
              if (options->verbose == true) {
                QString::toLocal8Bit_helper((QChar *)&local_2d8,(longlong)(fileName->d).ptr);
                pQVar15 = (QString *)local_2d8.d.ptr;
                if ((QString *)local_2d8.d.ptr == (QString *)0x0) {
                  pQVar15 = (QString *)&QByteArray::_empty;
                }
                fprintf(__stream,"Skipping \"%s\", architecture mismatch\n",pQVar15);
                if (&(local_2d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,1,0x10);
                  }
                }
              }
              (__return_storage_ptr__->d).d = (Data *)0x0;
              (__return_storage_ptr__->d).ptr = (QString *)0x0;
              (__return_storage_ptr__->d).size = 0;
              bVar17 = true;
              uVar12 = 0;
            }
          }
          else {
            QVar19.m_data = (storage_type_conflict *)pQStack_270;
            QVar19.m_size = (qsizetype)psStack_268;
            QVar23.m_data = "lib";
            QVar23.m_size = 3;
            cVar10 = QtPrivate::startsWith(QVar19,QVar23);
            uVar12 = 1;
            bVar17 = false;
            if (cVar10 != '\0') {
              QVar20.m_data = psVar16;
              QVar20.m_size = (qsizetype)&local_2d8;
              QString::fromLatin1(QVar20);
              pcVar7 = local_2b8.d.ptr;
              pDVar6 = local_2b8.d.d;
              qVar5 = local_2d8.d.size;
              pDVar4 = local_2d8.d.d;
              local_2d8.d.d = local_2b8.d.d;
              local_2b8.d.d = pDVar4;
              local_2b8.d.ptr = local_2d8.d.ptr;
              local_2d8.d.ptr = pcVar7;
              local_2d8.d.size = local_2b8.d.size;
              local_2b8.d.size = qVar5;
              if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
                }
              }
              local_2d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_2d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_2d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              local_2f8._8_8_ = &DAT_00000004;
              local_2e8 = (QString *)0x145d9a;
              local_2e0 = &local_2b8;
              this = (QStringBuilder<QLatin1String,_QString_&> *)(local_2f8 + 8);
              QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>(&local_2d8,this);
              absoluteFilePath((QString *)this,options,&local_2d8);
              cVar10 = QFile::exists((QString *)this);
              if ((QArrayData *)local_2f8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_2f8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_2f8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_2f8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_2f8._8_8_,2,0x10);
                }
              }
              if (cVar10 != '\0') {
                QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                          ((QMovableArrayOps<QString> *)&local_258,local_258.size,&local_2d8);
                QList<QString>::end((QList<QString> *)&local_258);
              }
              if (&(local_2d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,2,0x10);
                }
              }
              bVar17 = false;
            }
          }
          if (&(local_2b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_278 != (QArrayData *)0x0) {
            LOCK();
            (local_278->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_278->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_278->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_278,1,0x10);
            }
          }
          if (bVar17) goto LAB_0011ddb6;
          pcVar13 = fgets((char *)local_238,0x200,(FILE *)local_2f8._0_8_);
        } while (pcVar13 != (char *)0x0);
      }
      qVar5 = local_258.size;
      pQVar15 = local_258.ptr;
      pDVar9 = local_258.d;
      local_258.d = (Data *)0x0;
      local_258.ptr = (QString *)0x0;
      (__return_storage_ptr__->d).d = pDVar9;
      (__return_storage_ptr__->d).ptr = pQVar15;
      local_258.size = 0;
      (__return_storage_ptr__->d).size = qVar5;
LAB_0011ddb6:
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_258);
    }
    if ((FILE *)local_2f8._0_8_ != (FILE *)0x0) {
      pclose((FILE *)local_2f8._0_8_);
    }
  }
  if (&(local_298.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_298.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList getQtLibsFromElf(const Options &options, const QString &fileName)
{
    QString readElf = llvmReadobjPath(options);
    if (!QFile::exists(readElf)) {
        fprintf(stderr, "Command does not exist: %s\n", qPrintable(readElf));
        return QStringList();
    }

    readElf = "%1 --needed-libs %2"_L1.arg(shellQuote(readElf), shellQuote(fileName));

    auto readElfCommand = openProcess(readElf);
    if (!readElfCommand) {
        fprintf(stderr, "Cannot execute command %s\n", qPrintable(readElf));
        return QStringList();
    }

    QStringList ret;

    bool readLibs = false;
    char buffer[512];
    while (fgets(buffer, sizeof(buffer), readElfCommand.get()) != nullptr) {
        QByteArray line = QByteArray::fromRawData(buffer, qstrlen(buffer));
        QString library;
        line = line.trimmed();
        if (!readLibs) {
            if (line.startsWith("Arch: ")) {
                auto it = elfArchitectures.find(line.mid(6));
                if (it == elfArchitectures.constEnd() || *it != options.currentArchitecture.toLatin1()) {
                    if (options.verbose)
                        fprintf(stdout, "Skipping \"%s\", architecture mismatch\n", qPrintable(fileName));
                    return {};
                }
            }
            readLibs = line.startsWith("NeededLibraries");
            continue;
        }
        if (!line.startsWith("lib"))
            continue;
        library = QString::fromLatin1(line);
        QString libraryName = "lib/"_L1 + library;
        if (QFile::exists(absoluteFilePath(&options, libraryName)))
            ret += libraryName;
    }

    return ret;
}